

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
::best_solution_recorder
          (best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
           *this,random_engine *rng,uint thread_number,quadratic_cost_type<float> *costs,
          double cost_constant,int variables,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *constraints,int population_size)

{
  rep rVar1;
  allocator_type local_29;
  value_type_conflict2 local_28;
  
  (this->m_start).__d.__r = 0;
  storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::storage
            (&this->m_storage,rng,costs,cost_constant,population_size,variables,constraints);
  local_28 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->m_kappa_append,(ulong)thread_number,&local_28,&local_29);
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->m_start).__d.__r = rVar1;
  return;
}

Assistant:

best_solution_recorder(random_engine& rng,
                           const unsigned thread_number,
                           const Cost& costs,
                           const double cost_constant,
                           const int variables,
                           const std::vector<merged_constraint>& constraints,
                           const int population_size)
      : m_storage{ rng,       costs,      cost_constant, population_size,
                   variables, constraints }
      , m_kappa_append(std::size_t{ thread_number }, 0.0)
    {
        m_start = std::chrono::steady_clock::now();
    }